

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.h
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingInputStream::CopyingInputStream(CopyingInputStream *this)

{
  CopyingInputStream *this_local;
  
  this->_vptr_CopyingInputStream = (_func_int **)&PTR__CopyingInputStream_00a1a7b8;
  return;
}

Assistant:

class PROTOBUF_EXPORT CopyingInputStream {
 public:
  virtual ~CopyingInputStream() = default;

  // Reads up to "size" bytes into the given buffer.  Returns the number of
  // bytes read.  Read() waits until at least one byte is available, or
  // returns zero if no bytes will ever become available (EOF), or -1 if a
  // permanent read error occurred.
  virtual int Read(void* buffer, int size) = 0;

  // Skips the next "count" bytes of input.  Returns the number of bytes
  // actually skipped.  This will always be exactly equal to "count" unless
  // EOF was reached or a permanent read error occurred.
  //
  // The default implementation just repeatedly calls Read() into a scratch
  // buffer.
  virtual int Skip(int count);
}